

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O2

bool __thiscall MipsElfFile::setSection(MipsElfFile *this,string *name)

{
  pointer ppEVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  do {
    ppEVar1 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)(this->elf).segments.
                  super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3);
    if (args <= pbVar4) {
      iVar2 = ElfFile::findSegmentlessSection(&this->elf,name);
      if (iVar2 == -1) {
        bVar3 = false;
        Logger::queueError<std::__cxx11::string>((Logger *)0x0,0x180214,(char *)name,args);
      }
      else {
        this->segment = -1;
LAB_0016f4bd:
        this->section = iVar2;
        bVar3 = true;
      }
      return bVar3;
    }
    iVar2 = ElfSegment::findSection(ppEVar1[(long)pbVar4],name);
    if (iVar2 != -1) {
      this->segment = (int)pbVar4;
      goto LAB_0016f4bd;
    }
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(pbVar4->_M_dataplus)._M_p + 1);
  } while( true );
}

Assistant:

bool MipsElfFile::setSection(const std::string& name)
{
	// look in segments
	for (size_t i = 0; i < elf.getSegmentCount(); i++)
	{
		ElfSegment* seg = elf.getSegment(i);
		int n = seg->findSection(name);
		if (n != -1)
		{
			segment = (int) i;
			section = n;
			return true;
		}
	}

	// look in stray sections
	int n = elf.findSegmentlessSection(name);
	if (n != -1)
	{
		segment = -1;
		section = n;
		return true;
	}

	Logger::queueError(Logger::Warning, "Section %s not found",name);
	return false;
}